

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  TestMoreStuffImpl *in_RDX;
  Client local_a0;
  TestMoreStuffImpl *local_88;
  undefined1 local_70 [16];
  Client cap;
  Reader params;
  TestMoreStuffImpl *this_local;
  CallFooWhenResolvedContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
  ::getParams((Reader *)&cap.field_0x10,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams::Reader::getCap
            ((Client *)(local_70 + 8),(Reader *)&cap.field_0x10);
  Capability::Client::whenResolved((Client *)local_70);
  capnproto_test::capnp::test::TestInterface::Client::Client(&local_a0,(Client *)(local_70 + 8));
  local_88 = this_local;
  kj::Promise<void>::
  then<capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0>
            ((Promise<void> *)this,(Type *)local_70);
  callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)
  ::$_0::~__0((__0 *)&local_a0);
  kj::Promise<void>::~Promise((Promise<void> *)local_70);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)(local_70 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }